

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

bool gguf_read_emplace_helper<bool>
               (gguf_reader *gr,vector<gguf_kv,_std::allocator<gguf_kv>_> *kv,string *key,
               bool is_array,size_t n)

{
  bool bVar1;
  ulong uVar2;
  byte in_CL;
  undefined7 in_register_00000009;
  void *in_RDX;
  gguf_reader *in_RDI;
  bool value_1;
  length_error *anon_var_0;
  bad_alloc *anon_var_0_1;
  vector<bool,_std::allocator<bool>_> value;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  vector<gguf_kv,_std::allocator<gguf_kv>_> *in_stack_ffffffffffffff70;
  undefined1 local_79;
  size_t in_stack_ffffffffffffff88;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff9c;
  byte local_1;
  
  if ((in_CL & 1) == 0) {
    uVar2 = gguf_reader::read(in_RDI,(int)&local_79,in_RDX,CONCAT71(in_register_00000009,in_CL));
    if ((uVar2 & 1) == 0) {
      local_1 = 0;
      goto LAB_00193c1d;
    }
    std::vector<gguf_kv,std::allocator<gguf_kv>>::emplace_back<std::__cxx11::string_const&,bool&>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(bool *)in_stack_ffffffffffffff60
              );
  }
  else {
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)0x193a4c);
    bVar1 = gguf_reader::read<bool>
                      ((gguf_reader *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (bVar1) {
      std::vector<gguf_kv,std::allocator<gguf_kv>>::
      emplace_back<std::__cxx11::string_const&,std::vector<bool,std::allocator<bool>>&>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    }
    else {
      local_1 = 0;
    }
    uVar3 = (uint)!bVar1;
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x193bc1);
    if (uVar3 != 0) goto LAB_00193c1d;
  }
  local_1 = 1;
LAB_00193c1d:
  return (bool)(local_1 & 1);
}

Assistant:

bool gguf_read_emplace_helper(const struct gguf_reader & gr, std::vector<struct gguf_kv> & kv, const std::string & key, const bool is_array, const size_t n) {
    if (is_array) {
        std::vector<T> value;
        try {
            if (!gr.read(value, n)) {
                return false;
            }
        } catch (std::length_error &) {
            fprintf(stderr, "%s: encountered length_error while reading value for key '%s'\n", __func__, key.c_str());
            return false;
        } catch (std::bad_alloc &) {
            fprintf(stderr, "%s: encountered bad_alloc error while reading value for key '%s'\n", __func__, key.c_str());
            return false;
        }
        kv.emplace_back(key, value);
    } else {
        T value;
        if (!gr.read(value)) {
            return false;
        }
        kv.emplace_back(key, value);
    }
    return true;
}